

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listener.c
# Opt level: O0

int nni_listener_setopt(nni_listener *l,char *name,void *val,size_t sz,nni_type t)

{
  int iVar1;
  bool bVar2;
  nni_option *pnStack_40;
  int rv;
  nni_option *o;
  nni_type t_local;
  size_t sz_local;
  void *val_local;
  char *name_local;
  nni_listener *l_local;
  
  if (((l->l_ops).l_setopt == (_func_int_void_ptr_char_ptr_void_ptr_size_t_nni_type *)0x0) ||
     (l_local._4_4_ = (*(l->l_ops).l_setopt)(l->l_data,name,val,sz,t), l_local._4_4_ == 9)) {
    pnStack_40 = (l->l_ops).l_options;
    while( true ) {
      bVar2 = false;
      if (pnStack_40 != (nni_option *)0x0) {
        bVar2 = pnStack_40->o_name != (char *)0x0;
      }
      if (!bVar2) {
        return 9;
      }
      iVar1 = strcmp(pnStack_40->o_name,name);
      if (iVar1 == 0) break;
      pnStack_40 = pnStack_40 + 1;
    }
    if (pnStack_40->o_set == (_func_int_void_ptr_void_ptr_size_t_nni_type *)0x0) {
      l_local._4_4_ = 0x18;
    }
    else {
      l_local._4_4_ = (*pnStack_40->o_set)(l->l_data,val,sz,t);
    }
  }
  return l_local._4_4_;
}

Assistant:

int
nni_listener_setopt(
    nni_listener *l, const char *name, const void *val, size_t sz, nni_type t)
{
	nni_option *o;

	if (l->l_ops.l_setopt != NULL) {
		int rv = l->l_ops.l_setopt(l->l_data, name, val, sz, t);
		if (rv != NNG_ENOTSUP) {
			return (rv);
		}
	}

	for (o = l->l_ops.l_options; o && o->o_name; o++) {
		if (strcmp(o->o_name, name) != 0) {
			continue;
		}
		if (o->o_set == NULL) {
			return (NNG_EREADONLY);
		}

		return (o->o_set(l->l_data, val, sz, t));
	}

	return (NNG_ENOTSUP);
}